

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O2

void update_irq_state(ymz280b_state *chip)

{
  if ((chip->irq_enable == '\0') || ((chip->irq_mask & chip->status_register) == 0)) {
    if (chip->irq_state != '\0') {
      chip->irq_state = '\0';
      if (chip->irq_handler != (_func_void_void_ptr_UINT8 *)0x0) {
        (*chip->irq_handler)(chip->irq_param,'\0');
        return;
      }
    }
  }
  else if (chip->irq_state == '\0') {
    chip->irq_state = '\x01';
    if (chip->irq_handler != (_func_void_void_ptr_UINT8 *)0x0) {
      (*chip->irq_handler)(chip->irq_param,'\x01');
      return;
    }
  }
  return;
}

Assistant:

INLINE void update_irq_state(ymz280b_state *chip)
{
	int irq_bits = chip->status_register & chip->irq_mask;

	/* always off if the enable is off */
	if (!chip->irq_enable)
		irq_bits = 0;

	/* update the state if changed */
	if (irq_bits && !chip->irq_state)
	{
		chip->irq_state = 1;
		if (chip->irq_handler != NULL)
			chip->irq_handler(chip->irq_param, 1);
		//else logerror("YMZ280B: IRQ generated, but no callback specified!");
	}
	else if (!irq_bits && chip->irq_state)
	{
		chip->irq_state = 0;
		if (chip->irq_handler != NULL)
			chip->irq_handler(chip->irq_param, 0);
		//else logerror("YMZ280B: IRQ generated, but no callback specified!");
	}
}